

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

char * loopconc(ident *id,int n,uint *body,bool space)

{
  char *pcVar1;
  size_t sVar2;
  int i;
  vector<char> s;
  tagval v;
  identstack stack;
  char local_79;
  vector<char> local_78;
  ident *local_68;
  uint *local_60;
  anon_union_8_5_08252708_for_identval_0 local_58 [2];
  identstack local_48;
  
  local_78.buf = (char *)0x0;
  local_78.alen = 0;
  local_78.ulen = 0;
  i = 0;
  if (n < 1) {
    n = 0;
  }
  local_68 = id;
  local_60 = body;
  for (; n != i; i = i + 1) {
    setiter(local_68,i,&local_48);
    runcode(local_60,(tagval *)local_58);
    pcVar1 = tagval::getstr((tagval *)local_58);
    sVar2 = strlen(pcVar1);
    if (i != 0 && space) {
      local_79 = ' ';
      vector<char>::add(&local_78,&local_79);
    }
    vector<char>::put(&local_78,pcVar1,(int)sVar2);
    freearg((tagval *)local_58);
  }
  poparg(local_68);
  local_58[0].i._0_1_ = 0;
  vector<char>::add(&local_78,(char *)&local_58[0].i);
  pcVar1 = newstring(local_78.buf,(long)local_78.ulen - 1);
  vector<char>::~vector(&local_78);
  return pcVar1;
}

Assistant:

char *loopconc(ident *id, int n, uint *body, bool space)
{
    identstack stack;
    vector<char> s;
    loopi(n)
    {
        setiter(*id, i, stack);
        tagval v;
        executeret(body, v);
        const char *vstr = v.getstr();
        int len = strlen(vstr);
        if(space && i) s.add(' ');
        s.put(vstr, len);
        freearg(v);
    }
    poparg(*id);
    s.add('\0');
    return newstring(s.getbuf(), s.length()-1);
}